

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ManResubVerify(Gia_ResbMan_t *p,word *pFunc)

{
  Vec_Ptr_t *p_00;
  Vec_Wrd_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int i_00;
  int i_01;
  word *pOut;
  byte local_c6;
  byte local_c5;
  word *local_98;
  word *local_90;
  word *pDiv;
  word *pDiv1;
  word *pDiv0;
  int iVar1;
  int iVar0;
  int iLit1;
  int iLit0;
  int i;
  word *pDivRes;
  int RetValue;
  int iTopLit;
  int nVars;
  word *pFunc_local;
  Gia_ResbMan_t *p_local;
  
  iVar2 = Vec_PtrSize(p->vDivs);
  iVar3 = Vec_IntSize(p->vGates);
  if (iVar3 == 0) {
    p_local._4_4_ = 0xffffffff;
  }
  else {
    iVar3 = Vec_IntEntryLast(p->vGates);
    if (iVar3 < 0) {
      __assert_fail("iTopLit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x1cf,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
    }
    if (iVar3 == 0) {
      if (pFunc != (word *)0x0) {
        Abc_TtClear(pFunc,p->nWords);
      }
      p_local._4_4_ = Abc_TtIsConst0(p->pSets[1],p->nWords);
    }
    else if (iVar3 == 1) {
      if (pFunc != (word *)0x0) {
        Abc_TtFill(pFunc,p->nWords);
      }
      p_local._4_4_ = Abc_TtIsConst0(p->pSets[0],p->nWords);
    }
    else {
      iVar4 = Abc_Lit2Var(iVar3);
      if (iVar4 < iVar2) {
        iVar2 = Vec_IntSize(p->vGates);
        if (iVar2 != 1) {
          __assert_fail("Vec_IntSize(p->vGates) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                        ,0x1dc,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
        }
        p_00 = p->vDivs;
        iVar2 = Abc_Lit2Var(iVar3);
        _iLit0 = (word *)Vec_PtrEntry(p_00,iVar2);
      }
      else {
        iVar4 = Vec_IntSize(p->vGates);
        if (iVar4 < 2) {
          __assert_fail("Vec_IntSize(p->vGates) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                        ,0x1e2,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
        }
        iVar4 = Vec_IntSize(p->vGates);
        if (iVar4 % 2 != 1) {
          __assert_fail("Vec_IntSize(p->vGates) % 2 == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                        ,0x1e3,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
        }
        iVar4 = Abc_Lit2Var(iVar3);
        iVar5 = Vec_IntSize(p->vGates);
        if (iVar4 - iVar2 != iVar5 / 2 + -1) {
          __assert_fail("Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(p->vGates)/2-1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                        ,0x1e4,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
        }
        pVVar1 = p->vSims;
        iVar4 = p->nWords;
        iVar5 = Vec_IntSize(p->vGates);
        Vec_WrdFill(pVVar1,(iVar4 * iVar5) / 2,0);
        for (iLit1 = 0; iVar4 = Vec_IntSize(p->vGates), iLit1 + 1 < iVar4; iLit1 = iLit1 + 2) {
          iVar4 = Vec_IntEntry(p->vGates,iLit1);
          iVar5 = Vec_IntEntry(p->vGates,iLit1 + 1);
          i_00 = Abc_Lit2Var(iVar4);
          i_01 = Abc_Lit2Var(iVar5);
          if (i_00 < iVar2) {
            local_90 = (word *)Vec_PtrEntry(p->vDivs,i_00);
          }
          else {
            local_90 = Vec_WrdEntryP(p->vSims,p->nWords * (i_00 - iVar2));
          }
          if (i_01 < iVar2) {
            local_98 = (word *)Vec_PtrEntry(p->vDivs,i_01);
          }
          else {
            local_98 = Vec_WrdEntryP(p->vSims,p->nWords * (i_01 - iVar2));
          }
          pOut = Vec_WrdEntryP(p->vSims,(p->nWords * iLit1) / 2);
          if (i_00 < i_01) {
            iVar4 = Abc_LitIsCompl(iVar4);
            iVar5 = Abc_LitIsCompl(iVar5);
            Abc_TtAndCompl(pOut,local_90,iVar4,local_98,iVar5,p->nWords);
          }
          else {
            if (i_00 <= i_01) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                            ,0x1f5,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
            }
            iVar4 = Abc_LitIsCompl(iVar4);
            if (iVar4 != 0) {
              __assert_fail("!Abc_LitIsCompl(iLit0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                            ,0x1f1,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
            }
            iVar4 = Abc_LitIsCompl(iVar5);
            if (iVar4 != 0) {
              __assert_fail("!Abc_LitIsCompl(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                            ,0x1f2,"int Gia_ManResubVerify(Gia_ResbMan_t *, word *)");
            }
            Abc_TtXor(pOut,local_90,local_98,p->nWords,0);
          }
        }
        pVVar1 = p->vSims;
        iVar2 = p->nWords;
        iVar4 = Vec_IntSize(p->vGates);
        _iLit0 = Vec_WrdEntryP(pVVar1,iVar2 * (iVar4 / 2 + -1));
      }
      iVar2 = Abc_LitIsCompl(iVar3);
      if (iVar2 == 0) {
        iVar2 = Abc_TtIntersectOne(p->pSets[0],0,_iLit0,0,p->nWords);
        local_c6 = 0;
        if (iVar2 == 0) {
          iVar2 = Abc_TtIntersectOne(p->pSets[1],0,_iLit0,1,p->nWords);
          local_c6 = iVar2 != 0 ^ 0xff;
        }
      }
      else {
        iVar2 = Abc_TtIntersectOne(p->pSets[1],0,_iLit0,0,p->nWords);
        local_c5 = 0;
        local_c6 = local_c5;
        if (iVar2 == 0) {
          iVar2 = Abc_TtIntersectOne(p->pSets[0],0,_iLit0,1,p->nWords);
          local_c6 = iVar2 != 0 ^ 0xff;
        }
      }
      pDivRes._4_4_ = (uint)(local_c6 & 1);
      if (pFunc != (word *)0x0) {
        iVar2 = p->nWords;
        iVar3 = Abc_LitIsCompl(iVar3);
        Abc_TtCopy(pFunc,_iLit0,iVar2,iVar3);
      }
      p_local._4_4_ = pDivRes._4_4_;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManResubVerify( Gia_ResbMan_t * p, word * pFunc )
{
    int nVars = Vec_PtrSize(p->vDivs);
    int iTopLit, RetValue;
    word * pDivRes; 
    if ( Vec_IntSize(p->vGates) == 0 )
        return -1;
    iTopLit = Vec_IntEntryLast(p->vGates);
    assert( iTopLit >= 0 );
    if ( iTopLit == 0 )
    {
        if ( pFunc ) Abc_TtClear( pFunc, p->nWords );
        return Abc_TtIsConst0( p->pSets[1], p->nWords );
    }
    if ( iTopLit == 1 )
    {
        if ( pFunc ) Abc_TtFill( pFunc, p->nWords );
        return Abc_TtIsConst0( p->pSets[0], p->nWords );
    }
    if ( Abc_Lit2Var(iTopLit) < nVars )
    {
        assert( Vec_IntSize(p->vGates) == 1 );
        pDivRes = (word *)Vec_PtrEntry( p->vDivs, Abc_Lit2Var(iTopLit) );
    }
    else
    {
        int i, iLit0, iLit1;
        assert( Vec_IntSize(p->vGates) > 1 );
        assert( Vec_IntSize(p->vGates) % 2 == 1 );
        assert( Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(p->vGates)/2-1 );
        Vec_WrdFill( p->vSims, p->nWords * Vec_IntSize(p->vGates)/2, 0 );
        Vec_IntForEachEntryDouble( p->vGates, iLit0, iLit1, i )
        {
            int iVar0 = Abc_Lit2Var(iLit0);
            int iVar1 = Abc_Lit2Var(iLit1);
            word * pDiv0 = iVar0 < nVars ? (word *)Vec_PtrEntry(p->vDivs, iVar0) : Vec_WrdEntryP(p->vSims, p->nWords*(iVar0 - nVars));
            word * pDiv1 = iVar1 < nVars ? (word *)Vec_PtrEntry(p->vDivs, iVar1) : Vec_WrdEntryP(p->vSims, p->nWords*(iVar1 - nVars));
            word * pDiv  = Vec_WrdEntryP(p->vSims, p->nWords*i/2);
            if ( iVar0 < iVar1 )
                Abc_TtAndCompl( pDiv, pDiv0, Abc_LitIsCompl(iLit0), pDiv1, Abc_LitIsCompl(iLit1), p->nWords );
            else if ( iVar0 > iVar1 )
            {
                assert( !Abc_LitIsCompl(iLit0) );
                assert( !Abc_LitIsCompl(iLit1) );
                Abc_TtXor( pDiv, pDiv0, pDiv1, p->nWords, 0 );
            }
            else assert( 0 );
        }
        pDivRes = Vec_WrdEntryP( p->vSims, p->nWords*(Vec_IntSize(p->vGates)/2-1) );
    }
    if ( Abc_LitIsCompl(iTopLit) )
        RetValue = !Abc_TtIntersectOne(p->pSets[1], 0, pDivRes, 0, p->nWords) && !Abc_TtIntersectOne(p->pSets[0], 0, pDivRes, 1, p->nWords);
    else
        RetValue = !Abc_TtIntersectOne(p->pSets[0], 0, pDivRes, 0, p->nWords) && !Abc_TtIntersectOne(p->pSets[1], 0, pDivRes, 1, p->nWords);
    if ( pFunc ) Abc_TtCopy( pFunc, pDivRes, p->nWords, Abc_LitIsCompl(iTopLit) );
    return RetValue;
}